

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::drawCapsule(Skeleton *this,Joint *joint)

{
  GLdouble radius;
  bool bVar1;
  undefined8 uVar2;
  reference ppJVar3;
  double dVar4;
  Joint *child;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  undefined8 local_b8;
  GLfloat color [4];
  GLfloat white [4];
  GLUquadric *q;
  double r;
  double axisLength;
  Vector3D jointAxis;
  Vector3D jointScale;
  Vector3D jointRot;
  Vector3D jointPos;
  Joint *joint_local;
  Skeleton *this_local;
  
  Vector3D::Vector3D((Vector3D *)&jointRot.z,&(joint->super_SceneObject).position);
  Vector3D::Vector3D((Vector3D *)&jointScale.z,&(joint->super_SceneObject).rotation);
  Vector3D::Vector3D((Vector3D *)&jointAxis.z,&(joint->super_SceneObject).scale);
  Vector3D::Vector3D((Vector3D *)&axisLength,&joint->axis);
  dVar4 = Vector3D::norm((Vector3D *)&axisLength);
  radius = joint->capsuleRadius;
  uVar2 = gluNewQuadric();
  color[2] = 1.0;
  color[3] = 1.0;
  local_b8 = 0;
  color[0] = 0.25;
  color[1] = 0.25;
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,color + 2);
  glMaterialfv(0x408,0x1201,&local_b8);
  glEnable(0xbe2);
  glBlendFunc(1);
  glPushMatrix();
  glTranslated(jointRot.z,jointPos.x,jointPos.y);
  glRotatef((float)jointScale.z,0x3f800000,0);
  glRotatef((float)jointRot.x,0,0x3f800000);
  glRotatef((float)jointRot.y,0,0,0x3f800000);
  glScalef((float)jointAxis.z,(float)jointScale.x,(float)jointScale.y);
  glPushMatrix();
  Vector3D::Vector3D((Vector3D *)&__range2,(Vector3D *)&axisLength);
  setZAxis(this,(Vector3D *)&__range2);
  glPushMatrix();
  glRotated(0xc056800000000000,0x3ff0000000000000,0);
  drawSemisphere(radius,0x19,0x19);
  glPopMatrix();
  gluCylinder(radius,radius,dVar4,uVar2,0x19);
  glPushMatrix();
  glTranslated(0,0,dVar4);
  glRotated(0x4056800000000000,0x3ff0000000000000,0);
  drawSemisphere(radius,0x19,0x19);
  glPopMatrix();
  glPopMatrix();
  glTranslated(axisLength,jointAxis.x,jointAxis.y);
  __end2 = std::
           vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
           begin(&joint->kids);
  child = (Joint *)std::
                   vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                   ::end(&joint->kids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppJVar3 = __gnu_cxx::
              __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
              ::operator*(&__end2);
    drawCapsule(this,*ppJVar3);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
    ::operator++(&__end2);
  }
  glPopMatrix();
  glDisable(0xbe2);
  gluDeleteQuadric(uVar2);
  return;
}

Assistant:

void Skeleton::drawCapsule(Joint * joint)
  {
    Vector3D jointPos = joint->position;
    Vector3D jointRot = joint->rotation;
    Vector3D jointScale = joint->scale;
    Vector3D jointAxis = joint->axis;
    double axisLength = jointAxis.norm();
    double r = joint->capsuleRadius;
    GLUquadric* q = gluNewQuadric();
    GLfloat white[4] = { 1., 1., 1., 1. };
    GLfloat color[4] = { 0., 0., 0.25, .25 };

    glEnable(GL_LIGHTING);
    glEnable(GL_LIGHT0);
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
    glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);

    glEnable(GL_BLEND);
    //glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glBlendFunc(GL_ONE, GL_ONE);

    glPushMatrix();

    glTranslated(jointPos.x, jointPos.y, jointPos.z);
    glRotatef(jointRot.x, 1.0f, 0.0f, 0.0f);
    glRotatef(jointRot.y, 0.0f, 1.0f, 0.0f);
    glRotatef(jointRot.z, 0.0f, 0.0f, 1.0f);
    glScalef(jointScale.x, jointScale.y, jointScale.z);

    glPushMatrix();
    setZAxis(jointAxis);

    glPushMatrix();
    glRotated(-90, 1, 0, 0);
    drawSemisphere(r, 25, 25);
    glPopMatrix();

    gluCylinder(q, r, r, axisLength, 25, 25);
    
    glPushMatrix();
    glTranslated(0, 0, axisLength);
    glRotated(90, 1, 0, 0);
    drawSemisphere(r, 25, 25);
    glPopMatrix();

    glPopMatrix();

    glTranslated(jointAxis.x, jointAxis.y, jointAxis.z);

    for (Joint* child : joint->kids)
      drawCapsule(child);

    glPopMatrix();

    glDisable(GL_BLEND);
    gluDeleteQuadric(q);
  }